

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

bool ON::IsDirectory(char *utf8pathname)

{
  int iVar1;
  undefined1 local_d0 [4];
  int stat_errno;
  stat buf;
  char local_2a [2];
  char *pcStack_28;
  char trim [2];
  char *stail;
  ON_String buffer;
  char *pcStack_10;
  bool rc;
  char *utf8pathname_local;
  
  buffer.m_s._7_1_ = 0;
  if ((utf8pathname != (char *)0x0) && (*utf8pathname != '\0')) {
    ON_String::ON_String((ON_String *)&stail);
    for (pcStack_28 = utf8pathname; *pcStack_28 != '\0'; pcStack_28 = pcStack_28 + 1) {
    }
    pcStack_28 = pcStack_28 + -1;
    pcStack_10 = utf8pathname;
    if ((*pcStack_28 == '\\') || (*pcStack_28 == '/')) {
      local_2a[0] = *pcStack_28;
      local_2a[1] = 0;
      ON_String::operator=((ON_String *)&stail,utf8pathname);
      ON_String::TrimRight((ON_String *)&stail,local_2a);
      iVar1 = ON_String::Length((ON_String *)&stail);
      if (0 < iVar1) {
        pcStack_10 = ON_String::operator_cast_to_char_((ON_String *)&stail);
      }
    }
    memset(local_d0,0,0x90);
    iVar1 = stat(pcStack_10,(stat *)local_d0);
    if ((iVar1 == 0) && (((uint)buf.st_nlink & 0xf000) == 0x4000)) {
      buffer.m_s._7_1_ = 1;
    }
    ON_String::~ON_String((ON_String *)&stail);
  }
  return (bool)(buffer.m_s._7_1_ & 1);
}

Assistant:

bool ON::IsDirectory( const char* utf8pathname )
{
  bool rc = false;

  if ( 0 != utf8pathname && 0 != utf8pathname[0] )
  {
    ON_String buffer;
    const char* stail = utf8pathname;
    while ( 0 != *stail )
      stail++;
    stail--;
    if ( '\\' == *stail || '/' == *stail ) 
    {
      const char trim[2] = {*stail,0};
      buffer = utf8pathname;
      buffer.TrimRight(trim);
      if ( buffer.Length() > 0 )
        utf8pathname = static_cast< const char* >(buffer);
    }
#if defined(ON_COMPILER_MSC)
    // this works on Windows
    struct _stat64 buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = _stat64( utf8pathname, &buf );
    if ( 0 == stat_errno && 0 != (_S_IFDIR & buf.st_mode) )
    {
      rc = true;
    }
#else
    // this works on Apple and gcc implementations.
    struct stat buf;
    memset(&buf,0,sizeof(buf));
    int stat_errno = stat( utf8pathname, &buf );
    if ( 0 == stat_errno && S_ISDIR(buf.st_mode) )
    {
      rc = true;
    }
#endif
  }

  return rc;
}